

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O2

bool __thiscall ELFIO::elfio::load_sections(elfio *this,istream *stream,bool is_lazy)

{
  elf_header *peVar1;
  elfio *peVar2;
  pointer puVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Elf_Word index;
  undefined4 extraout_var;
  section *psVar8;
  undefined4 extraout_var_00;
  char *__s;
  Elf_Half i;
  _Head_base<0UL,_ELFIO::section_*,_false> _Var9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  string_section_accessor str_reader;
  allocator<char> local_69;
  ulong local_68;
  istream *local_60;
  undefined8 local_58 [4];
  _Head_base<0UL,_ELFIO::section_*,_false> local_38;
  
  local_60 = stream;
  iVar4 = (*((this->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header[4])()
  ;
  uVar5 = (*((this->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header[8])()
  ;
  uVar6 = (*((this->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header[0x18]
          )();
  iVar7 = (*((this->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header[0x1a]
          )();
  lVar11 = CONCAT44(extraout_var,iVar7);
  if ((((ushort)uVar5 < 0x40 && (char)iVar4 == '\x02') && (short)uVar6 != 0) ||
     (((ushort)uVar5 < 0x28 && (char)iVar4 == '\x01') && (short)uVar6 != 0)) {
    return false;
  }
  uVar10 = (ulong)(uVar6 & 0xffff);
  local_68 = uVar10;
  while (bVar12 = uVar10 != 0, uVar10 = uVar10 - 1, bVar12) {
    psVar8 = create_section(this);
    (*psVar8->_vptr_section[0x24])(psVar8,local_60,lVar11,0,is_lazy);
    iVar4 = (*psVar8->_vptr_section[0x11])(psVar8);
    local_58[0] = CONCAT44(extraout_var_00,iVar4);
    (*psVar8->_vptr_section[0x12])(psVar8,local_58);
    lVar11 = lVar11 + (ulong)(uVar5 & 0xffff);
  }
  peVar1 = (this->header)._M_t.
           super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
           super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
           super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
  if (peVar1 == (elf_header *)0x0) {
    return true;
  }
  uVar5 = (*peVar1->_vptr_elf_header[0x20])();
  if ((short)uVar5 == 0) {
    return true;
  }
  peVar2 = (this->sections).parent;
  puVar3 = (peVar2->sections_).
           super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(uVar5 & 0xffff) <
      (ulong)((long)(peVar2->sections_).
                    super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3)) {
    local_38._M_head_impl =
         *(section **)
          &puVar3[uVar5 & 0xffff]._M_t.
           super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>;
  }
  else {
    local_38._M_head_impl = (section *)0x0;
  }
  for (uVar10 = 0; local_68 != uVar10; uVar10 = uVar10 + 1) {
    index = (**(code **)(*(long *)(((this->sections).parent)->sections_).
                                  super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_t.
                                  super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>
                        + 0xa8))();
    __s = string_section_accessor_template<ELFIO::section>::get_string
                    ((string_section_accessor_template<ELFIO::section> *)&local_38,index);
    if (__s != (char *)0x0) {
      peVar2 = (this->sections).parent;
      puVar3 = (peVar2->sections_).
               super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (uVar10 < (ulong)((long)(peVar2->sections_).
                                 super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3)) {
        _Var9._M_head_impl =
             *(section **)
              &puVar3[uVar10]._M_t.
               super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>;
      }
      else {
        _Var9._M_head_impl = (section *)0x0;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,__s,&local_69);
      (**(code **)(*(long *)_Var9._M_head_impl + 0x20))(_Var9._M_head_impl,(string *)local_58);
      std::__cxx11::string::~string((string *)local_58);
    }
  }
  return true;
}

Assistant:

bool load_sections( std::istream& stream, bool is_lazy )
    {
        unsigned char file_class = header->get_class();
        Elf_Half      entry_size = header->get_section_entry_size();
        Elf_Half      num        = header->get_sections_num();
        Elf64_Off     offset     = header->get_sections_offset();

        if ( ( num != 0 && file_class == ELFCLASS64 &&
               entry_size < sizeof( Elf64_Shdr ) ) ||
             ( num != 0 && file_class == ELFCLASS32 &&
               entry_size < sizeof( Elf32_Shdr ) ) ) {
            return false;
        }

        for ( Elf_Half i = 0; i < num; ++i ) {
            section* sec = create_section();

            // Load return value is ignored here
            // This allows retrieval of information from corrupted sections
            sec->load( stream,
                       static_cast<std::streamoff>( offset ) +
                           static_cast<std::streampos>( i ) * entry_size,
                       is_lazy );
            // To mark that the section is not permitted to reassign address
            // during layout calculation
            sec->set_address( sec->get_address() );
        }

        if ( Elf_Half shstrndx = get_section_name_str_index();
             SHN_UNDEF != shstrndx ) {
            string_section_accessor str_reader( sections[shstrndx] );
            for ( Elf_Half i = 0; i < num; ++i ) {
                Elf_Word section_offset = sections[i]->get_name_string_offset();
                const char* p = str_reader.get_string( section_offset );
                if ( p != nullptr ) {
                    sections[i]->set_name( p );
                }
            }
        }

        return true;
    }